

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifndef_guard_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::IfnDefGuardTest_Basic_Test::
IfnDefGuardTest_Basic_Test(IfnDefGuardTest_Basic_Test *this)

{
  IfnDefGuardTest_Basic_Test *this_local;
  
  IfnDefGuardTest::IfnDefGuardTest(&this->super_IfnDefGuardTest);
  (this->super_IfnDefGuardTest).super_Test._vptr_Test =
       (_func_int **)&PTR__IfnDefGuardTest_Basic_Test_02a01d50;
  return;
}

Assistant:

TEST_F(IfnDefGuardTest, Basic) {
  {
    io::Printer printer(output(), '$');

    const IfdefGuardPrinter ifdef_guard(&printer, "A/B-E.alpha");

    EXPECT_FALSE(printer.failed());
  }

  EXPECT_EQ(written(),
            "#ifndef A_B_E_ALPHA_\n"
            "#define A_B_E_ALPHA_\n"
            "\n"
            "\n"
            "#endif  // A_B_E_ALPHA_\n");
}